

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O2

int asn1_d2i_ex_primitive
              (ASN1_VALUE **pval,uchar **in,long inlen,ASN1_ITEM *it,int tag,int aclass,char opt)

{
  _union_257 *p_Var1;
  int iVar2;
  uint uVar3;
  ASN1_STRING *a;
  ASN1_INTEGER *pAVar4;
  ASN1_STRING *str;
  ASN1_OBJECT *pAVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte *length;
  byte *pbVar9;
  _union_257 *p_Var10;
  bool bVar11;
  char cst;
  uint local_7c;
  _union_257 *local_78;
  CBS cbs;
  byte *local_58;
  uchar oclass;
  uint32_t c;
  long plen;
  ASN1_TYPE *local_38;
  
  if (it->itype == '\0') {
    uVar6 = it->utype;
    uVar7 = tag;
  }
  else {
    if (it->itype != '\x05') {
      __assert_fail("it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x275,
                    "int asn1_d2i_ex_primitive(ASN1_VALUE **, const unsigned char **, long, const ASN1_ITEM *, int, int, char)"
                   );
    }
    uVar7 = 0xffffffff;
    uVar6 = tag;
  }
  local_7c = uVar6;
  p_Var10 = (_union_257 *)pval;
  if (uVar6 + 5 < 2) {
    if (-1 < (int)uVar7) {
      iVar2 = 0x89;
      iVar8 = 0x281;
LAB_001f5d25:
      ERR_put_error(0xc,0,iVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,iVar8);
      return 0;
    }
    if (opt != '\0') {
      iVar2 = 0x87;
      iVar8 = 0x285;
      goto LAB_001f5d25;
    }
    local_58 = *in;
    local_78 = (_union_257 *)pval;
    iVar2 = asn1_check_tlen(&plen,(int *)&local_7c,&oclass,&cst,&local_58,inlen,-1,0,'\0');
    if (iVar2 == 0) {
      iVar2 = 0x9e;
      iVar8 = 0x28c;
      goto LAB_001f5d25;
    }
    if (((oclass == '\0') && (uVar3 = local_7c - 1, uVar3 < 0x1e)) &&
       ((0x2fff8a3fU >> (uVar3 & 0x1f) & 1) != 0)) {
      uVar3 = *(uint *)(&DAT_002714a8 + (ulong)uVar3 * 4);
    }
    else {
      uVar3 = 0xfffffffd;
      local_7c = 0xfffffffd;
    }
    bVar11 = uVar6 == 0xfffffffb;
    p_Var10 = local_78;
    uVar6 = uVar3;
    if (((bVar11) && (uVar3 < 7)) && ((0x62U >> (uVar3 & 0x1f) & 1) != 0)) {
      if (cst != '\0') {
        iVar2 = 0xb3;
        iVar8 = 0x297;
        goto LAB_001f5d25;
      }
      cbs.data = local_58;
      cbs.len = plen;
      if ((uVar3 == 6) && (iVar2 = CBS_is_valid_asn1_oid(&cbs), uVar3 = local_7c, iVar2 == 0)) {
        iVar2 = 0x92;
        iVar8 = 0x29d;
        goto LAB_001f5d25;
      }
      if (uVar3 == 1) {
        if (cbs.len != 1) {
          iVar2 = 0x6a;
          iVar8 = 0x2a6;
          goto LAB_001f5d25;
        }
        if (1 < (byte)(*cbs.data + 1)) {
          iVar2 = 0x6d;
          iVar8 = 0x2ab;
          goto LAB_001f5d25;
        }
      }
      else if ((uVar3 == 5) && (cbs.len != 0)) {
        iVar2 = 0xa4;
        iVar8 = 0x2a1;
        goto LAB_001f5d25;
      }
      local_7c = 0xfffffffd;
      p_Var10 = local_78;
      uVar6 = 0xfffffffd;
    }
  }
  local_78 = p_Var10;
  iVar2 = 0;
  if (uVar7 != 0xffffffff) {
    uVar6 = uVar7;
    iVar2 = aclass;
  }
  local_58 = *in;
  iVar2 = asn1_check_tlen(&plen,(int *)0x0,(uchar *)0x0,&cst,&local_58,inlen,uVar6,iVar2,opt);
  p_Var10 = local_78;
  uVar6 = local_7c;
  if (iVar2 == -1) {
    return -1;
  }
  if (iVar2 == 0) {
    iVar2 = 0x9e;
    iVar8 = 0x2ba;
LAB_001f5eb5:
    ERR_put_error(0xc,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar8);
    return 0;
  }
  uVar7 = local_7c + 3;
  if ((uVar7 < 0x15) && ((0x180001U >> (uVar7 & 0x1f) & 1) != 0)) {
    if ((local_7c != 0xfffffffd) && (cst == '\0')) {
      iVar2 = 0xb2;
      iVar8 = 0x2c5;
      goto LAB_001f5eb5;
    }
    length = local_58 + (plen - (long)*in);
    pbVar9 = *in;
  }
  else {
    length = (byte *)plen;
    pbVar9 = local_58;
    if (cst != '\0') {
      iVar2 = 0xb3;
      iVar8 = 0x2d0;
      goto LAB_001f5eb5;
    }
  }
  local_58 = local_58 + plen;
  _oclass = pbVar9;
  if (it->funcs != (void *)0x0) {
    __assert_fail("it->funcs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,0x2ef,
                  "int asn1_ex_c2i(ASN1_VALUE **, const unsigned char *, long, int, const ASN1_ITEM *)"
                 );
  }
  if (it->utype == -4) {
    a = local_78->asn1_string;
    if (a == (ASN1_STRING *)0x0) {
      a = (ASN1_STRING *)ASN1_TYPE_new();
      if (a == (ASN1_STRING *)0x0) {
        p_Var10 = (_union_257 *)0x0;
        a = (ASN1_STRING *)(ASN1_TYPE *)0x0;
        goto LAB_001f6233;
      }
      p_Var10->asn1_string = a;
    }
    if (a->length != uVar6) {
      ASN1_TYPE_set((ASN1_TYPE *)a,uVar6,(void *)0x0);
    }
    local_78 = (_union_257 *)&a->data;
  }
  else {
    p_Var10 = (_union_257 *)0x0;
    a = (ASN1_STRING *)0x0;
  }
  p_Var1 = local_78;
  switch(uVar7) {
  case 0:
  case 7:
  case 0xf:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x21:
    cbs.data = pbVar9;
    cbs.len = (size_t)length;
    local_38 = (ASN1_TYPE *)a;
    switch(uVar6) {
    case 0x17:
      iVar2 = CBS_parse_utc_time(&cbs,(tm *)0x0,1);
      if (iVar2 != 0) goto switchD_001f5f17_caseD_19;
      iVar2 = 0x94;
      iVar8 = 0x361;
      break;
    case 0x18:
      iVar2 = CBS_parse_generalized_time(&cbs,(tm *)0x0,0);
      if (iVar2 != 0) goto switchD_001f5f17_caseD_19;
      iVar2 = 0x94;
      iVar8 = 0x368;
      break;
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
switchD_001f5f17_caseD_19:
      str = local_78->asn1_string;
      if (str == (ASN1_STRING *)0x0) {
        str = ASN1_STRING_type_new(uVar6);
        a = (ASN1_STRING *)local_38;
        if (str == (ASN1_STRING *)0x0) goto LAB_001f6233;
        local_78->asn1_string = str;
      }
      else {
        str->type = uVar6;
      }
      iVar2 = ASN1_STRING_set(str,_oclass,(int)length);
      if (iVar2 == 0) {
        ASN1_STRING_free(str);
        local_78->ptr = (char *)0x0;
        a = (ASN1_STRING *)local_38;
        goto LAB_001f6233;
      }
      goto LAB_001f61c4;
    case 0x1c:
      do {
        if (cbs.len == 0) goto switchD_001f5f17_caseD_19;
        iVar2 = CBS_get_utf32_be(&cbs,&c);
      } while (iVar2 != 0);
      iVar2 = 0x95;
      iVar8 = 0x351;
      break;
    case 0x1e:
      do {
        if (cbs.len == 0) goto switchD_001f5f17_caseD_19;
        iVar2 = CBS_get_ucs2_be(&cbs,&c);
      } while (iVar2 != 0);
      iVar2 = 0x8e;
      iVar8 = 0x348;
      break;
    default:
      if (uVar6 != 0xc) goto switchD_001f5f17_caseD_19;
      do {
        if (cbs.len == 0) goto switchD_001f5f17_caseD_19;
        iVar2 = CBS_get_utf8(&cbs,&c);
      } while (iVar2 != 0);
      iVar2 = 0x96;
      iVar8 = 0x35a;
    }
    ERR_put_error(0xc,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar8);
    a = (ASN1_STRING *)local_38;
    goto LAB_001f6233;
  default:
    iVar2 = 0xc1;
    iVar8 = 0x382;
    goto LAB_001f6328;
  case 4:
    if (length == (byte *)0x1) {
      *(uint *)local_78 = (uint)*pbVar9;
      goto LAB_001f62d0;
    }
    iVar2 = 0x6a;
    iVar8 = 0x318;
LAB_001f6328:
    ERR_put_error(0xc,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar8);
LAB_001f6233:
    ASN1_TYPE_free((ASN1_TYPE *)a);
    if (p_Var10 != (_union_257 *)0x0) {
      p_Var10->ptr = (char *)0x0;
    }
    return 0;
  case 5:
  case 0xd:
    pAVar4 = c2i_ASN1_INTEGER(&local_78->integer,(uchar **)&oclass,(long)length);
    if (pAVar4 == (ASN1_INTEGER *)0x0) goto LAB_001f6233;
    p_Var1->asn1_string->type = p_Var1->asn1_string->type & 0x100U | uVar6;
    local_38 = (ASN1_TYPE *)a;
    break;
  case 6:
    pAVar5 = (ASN1_OBJECT *)
             c2i_ASN1_BIT_STRING(&local_78->bit_string,(uchar **)&oclass,(long)length);
    goto LAB_001f62c7;
  case 8:
    if (length != (byte *)0x0) {
      iVar2 = 0xa4;
      iVar8 = 0x310;
      goto LAB_001f6328;
    }
    *local_78 = (_union_257)0x1;
    local_38 = (ASN1_TYPE *)a;
    break;
  case 9:
    pAVar5 = c2i_ASN1_OBJECT(&local_78->object,(uchar **)&oclass,(long)length);
LAB_001f62c7:
    if (pAVar5 != (ASN1_OBJECT *)0x0) goto LAB_001f62d0;
    goto LAB_001f6233;
  }
LAB_001f61c4:
  if (uVar6 == 5 && local_38 != (ASN1_TYPE *)0x0) {
    (local_38->value).ptr = (char *)0x0;
  }
LAB_001f62d0:
  *in = local_58;
  return 1;
}

Assistant:

static int asn1_d2i_ex_primitive(ASN1_VALUE **pval, const unsigned char **in,
                                 long inlen, const ASN1_ITEM *it, int tag,
                                 int aclass, char opt) {
  int ret = 0, utype;
  long plen;
  char cst;
  const unsigned char *p;
  const unsigned char *cont = NULL;
  long len;
  if (!pval) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NULL);
    return 0;  // Should never happen
  }

  assert(it->itype == ASN1_ITYPE_PRIMITIVE || it->itype == ASN1_ITYPE_MSTRING);
  if (it->itype == ASN1_ITYPE_MSTRING) {
    utype = tag;
    tag = -1;
  } else {
    utype = it->utype;
  }

  if (utype == V_ASN1_ANY || utype == V_ASN1_ANY_AS_STRING) {
    // If type is ANY need to figure out type from tag
    unsigned char oclass;
    if (tag >= 0) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TAGGED_ANY);
      return 0;
    }
    if (opt) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OPTIONAL_ANY);
      return 0;
    }
    const int is_string = utype == V_ASN1_ANY_AS_STRING;
    p = *in;
    ret = asn1_check_tlen(&plen, &utype, &oclass, &cst, &p, inlen, -1, 0, 0);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    }
    if (!is_supported_universal_type(utype, oclass)) {
      utype = V_ASN1_OTHER;
    }
    // These three types are not represented as |ASN1_STRING|, so they must be
    // parsed separately and then treated as an opaque |V_ASN1_OTHER|.
    if (is_string && (utype == V_ASN1_OBJECT || utype == V_ASN1_NULL ||
                      utype == V_ASN1_BOOLEAN)) {
      if (cst) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_PRIMITIVE);
        return 0;
      }
      CBS cbs;
      CBS_init(&cbs, p, plen);
      if (utype == V_ASN1_OBJECT && !CBS_is_valid_asn1_oid(&cbs)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_OBJECT_ENCODING);
        return 0;
      }
      if (utype == V_ASN1_NULL && CBS_len(&cbs) != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NULL_IS_WRONG_LENGTH);
        return 0;
      }
      if (utype == V_ASN1_BOOLEAN) {
        if (CBS_len(&cbs) != 1) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_BOOLEAN_IS_WRONG_LENGTH);
          return 0;
        }
        uint8_t v = CBS_data(&cbs)[0];
        if (v != 0 && v != 0xff) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
          return 0;
        }
      }
      utype = V_ASN1_OTHER;
    }
  }
  if (tag == -1) {
    tag = utype;
    aclass = V_ASN1_UNIVERSAL;
  }
  p = *in;
  // Check header
  ret = asn1_check_tlen(&plen, NULL, NULL, &cst, &p, inlen, tag, aclass, opt);
  if (!ret) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
    return 0;
  } else if (ret == -1) {
    return -1;
  }
  ret = 0;
  // SEQUENCE, SET and "OTHER" are left in encoded form
  if ((utype == V_ASN1_SEQUENCE) || (utype == V_ASN1_SET) ||
      (utype == V_ASN1_OTHER)) {
    // SEQUENCE and SET must be constructed
    if (utype != V_ASN1_OTHER && !cst) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_CONSTRUCTED);
      return 0;
    }

    cont = *in;
    len = p - cont + plen;
    p += plen;
  } else if (cst) {
    // This parser historically supported BER constructed strings. We no
    // longer do and will gradually tighten this parser into a DER
    // parser. BER types should use |CBS_asn1_ber_to_der|.
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TYPE_NOT_PRIMITIVE);
    return 0;
  } else {
    cont = p;
    len = plen;
    p += plen;
  }

  // We now have content length and type: translate into a structure
  if (!asn1_ex_c2i(pval, cont, len, utype, it)) {
    goto err;
  }

  *in = p;
  ret = 1;
err:
  return ret;
}